

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdsa_asn1.cc
# Opt level: O1

ECDSA_SIG * d2i_ECDSA_SIG(ECDSA_SIG **sig,uchar **pp,long len)

{
  ECDSA_SIG *pEVar1;
  CBS cbs;
  CBS local_28;
  
  if (-1 < len) {
    local_28.data = *pp;
    local_28.len = len;
    pEVar1 = (ECDSA_SIG *)ECDSA_SIG_parse(&local_28);
    if (pEVar1 != (ECDSA_SIG *)0x0) {
      if (sig != (ECDSA_SIG **)0x0) {
        ECDSA_SIG_free(*sig);
        *sig = pEVar1;
      }
      *pp = local_28.data;
      return pEVar1;
    }
  }
  return (ECDSA_SIG *)0x0;
}

Assistant:

ECDSA_SIG *d2i_ECDSA_SIG(ECDSA_SIG **out, const uint8_t **inp, long len) {
  if (len < 0) {
    return NULL;
  }
  CBS cbs;
  CBS_init(&cbs, *inp, (size_t)len);
  ECDSA_SIG *ret = ECDSA_SIG_parse(&cbs);
  if (ret == NULL) {
    return NULL;
  }
  if (out != NULL) {
    ECDSA_SIG_free(*out);
    *out = ret;
  }
  *inp = CBS_data(&cbs);
  return ret;
}